

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_parser.hpp
# Opt level: O0

void __thiscall
jsoncons::cbor::basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::
basic_cbor_parser<jsoncons::bytes_source>
          (basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_> *this,
          bytes_source *source,cbor_decode_options *options,allocator<char> *alloc)

{
  _func_int **pp_Var1;
  allocator *in_RCX;
  undefined8 *in_RSI;
  ser_context *in_RDI;
  allocator *__a;
  allocator<unsigned_char> *this_00;
  string *this_01;
  vector<jsoncons::cbor::parse_state,_std::allocator<jsoncons::cbor::parse_state>_> *this_02;
  
  ser_context::ser_context(in_RDI);
  in_RDI->_vptr_ser_context = (_func_int **)&PTR__basic_cbor_parser_01336230;
  *(undefined1 *)&in_RDI[1]._vptr_ser_context = 1;
  *(undefined1 *)((long)&in_RDI[1]._vptr_ser_context + 1) = 0;
  *(undefined1 *)((long)&in_RDI[1]._vptr_ser_context + 2) = 0;
  *(undefined4 *)((long)&in_RDI[1]._vptr_ser_context + 4) = 0;
  in_RDI[2]._vptr_ser_context = (_func_int **)0x0;
  *(undefined4 *)&in_RDI[3]._vptr_ser_context = 0;
  std::bitset<3UL>::bitset((bitset<3UL> *)0x2ddc83);
  __a = (allocator *)(in_RDI + 5);
  std::allocator<char>::allocator(__a);
  in_RDI[8]._vptr_ser_context = (_func_int **)in_RSI[2];
  pp_Var1 = (_func_int **)in_RSI[1];
  in_RDI[6]._vptr_ser_context = (_func_int **)*in_RSI;
  in_RDI[7]._vptr_ser_context = pp_Var1;
  this_00 = (allocator<unsigned_char> *)(in_RDI + 9);
  cbor_decode_options::cbor_decode_options
            ((cbor_decode_options *)this_00,(cbor_decode_options *)__a);
  this_01 = (string *)(in_RDI + 0xc);
  std::__cxx11::string::string(this_01,in_RCX);
  this_02 = (vector<jsoncons::cbor::parse_state,_std::allocator<jsoncons::cbor::parse_state>_> *)
            (in_RDI + 0x10);
  std::allocator<unsigned_char>::allocator<char>(this_00,(allocator<char> *)__a);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00,(allocator_type *)__a)
  ;
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x2ddd2b);
  std::allocator<jsoncons::cbor::parse_state>::allocator<char>
            ((allocator<jsoncons::cbor::parse_state> *)this_00,(allocator<char> *)__a);
  std::vector<jsoncons::cbor::parse_state,_std::allocator<jsoncons::cbor::parse_state>_>::vector
            ((vector<jsoncons::cbor::parse_state,_std::allocator<jsoncons::cbor::parse_state>_> *)
             this_00,(allocator_type *)__a);
  std::allocator<jsoncons::cbor::parse_state>::~allocator
            ((allocator<jsoncons::cbor::parse_state> *)0x2ddd6e);
  std::allocator<unsigned_char>::allocator<char>(this_00,(allocator<char> *)__a);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00,(allocator_type *)__a)
  ;
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x2dddb1);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x2dddc7);
  std::
  allocator<std::vector<jsoncons::cbor::basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::mapped_string,_std::allocator<jsoncons::cbor::basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::mapped_string>_>_>
  ::allocator<char>((allocator<std::vector<jsoncons::cbor::basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::mapped_string,_std::allocator<jsoncons::cbor::basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::mapped_string>_>_>
                     *)this_00,(allocator<char> *)__a);
  std::
  vector<std::vector<jsoncons::cbor::basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::mapped_string,_std::allocator<jsoncons::cbor::basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::mapped_string>_>,_std::allocator<std::vector<jsoncons::cbor::basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::mapped_string,_std::allocator<jsoncons::cbor::basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::mapped_string>_>_>_>
  ::vector((vector<std::vector<jsoncons::cbor::basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::mapped_string,_std::allocator<jsoncons::cbor::basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::mapped_string>_>,_std::allocator<std::vector<jsoncons::cbor::basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::mapped_string,_std::allocator<jsoncons::cbor::basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::mapped_string>_>_>_>
            *)this_00,(allocator_type *)__a);
  std::
  allocator<std::vector<jsoncons::cbor::basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::mapped_string,_std::allocator<jsoncons::cbor::basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::mapped_string>_>_>
  ::~allocator((allocator<std::vector<jsoncons::cbor::basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::mapped_string,_std::allocator<jsoncons::cbor::basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::mapped_string>_>_>
                *)0x2dde0a);
  std::vector<jsoncons::cbor::parse_state,std::allocator<jsoncons::cbor::parse_state>>::
  emplace_back<jsoncons::cbor::parse_mode,int>(this_02,(parse_mode *)this_01,(int *)this_00);
  return;
}

Assistant:

basic_cbor_parser(Sourceable&& source,
                      const cbor_decode_options& options = cbor_decode_options(),
                      const Allocator& alloc = Allocator())
       : alloc_(alloc),
         source_(std::forward<Sourceable>(source)),
         options_(options),
         text_buffer_(alloc),
         bytes_buffer_(alloc),
         state_stack_(alloc),
         typed_array_(alloc),
         stringref_map_stack_(alloc)
    {
        state_stack_.emplace_back(parse_mode::root,0);
    }